

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitTryTable
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,TryTable *curr)

{
  bool bVar1;
  BasicType local_1c;
  TryTable *local_18;
  TryTable *curr_local;
  BinaryenIRWriter<wasm::StackIRGenerator> *this_local;
  
  local_18 = curr;
  curr_local = (TryTable *)this;
  emit(this,(Expression *)curr);
  visitPossibleBlockContents(this,local_18->body);
  emitScopeEnd(this,(Expression *)local_18);
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)53>).
                      super_Expression.type,&local_1c);
  if (bVar1) {
    emitUnreachable(this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitTryTable(TryTable* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    emitUnreachable();
  }
}